

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsMouseClicked(int button,bool repeat)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  
  if (4 < (uint)button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x1164,"bool ImGui::IsMouseClicked(int, bool)");
  }
  fVar1 = (GImGui->IO).MouseDownDuration[(uint)button];
  if (((fVar1 != 0.0) || (NAN(fVar1))) &&
     (((!repeat ||
       (((fVar2 = (GImGui->IO).KeyRepeatDelay, fVar1 <= fVar2 || (fVar1 <= fVar2)) ||
        (fVar5 = (GImGui->IO).KeyRepeatRate * 0.5, fVar5 <= 0.0)))) ||
      (auVar3._0_4_ = fVar1 - fVar2, auVar3._4_4_ = (fVar1 - (GImGui->IO).DeltaTime) - fVar2,
      auVar3._8_4_ = 0.0 - fVar2, auVar3._12_4_ = 0.0 - fVar2, auVar4._4_4_ = fVar5,
      auVar4._0_4_ = fVar5, auVar4._8_4_ = fVar5, auVar4._12_4_ = fVar5,
      auVar4 = divps(auVar3,auVar4), (int)auVar4._0_4_ <= (int)auVar4._4_4_)))) {
    return false;
  }
  return true;
}

Assistant:

bool ImGui::IsMouseClicked(int button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        // FIXME: 2019/05/03: Our old repeat code was wrong here and led to doubling the repeat rate, which made it an ok rate for repeat on mouse hold.
        int amount = CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate * 0.5f);
        if (amount > 0)
            return true;
    }

    return false;
}